

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

void __thiscall docopt::value::throwIfNotKind(value *this,Kind expected)

{
  runtime_error *this_00;
  allocator local_39;
  string error;
  
  if (this->kind == expected) {
    return;
  }
  std::__cxx11::string::string((string *)&error,"Illegal cast to ",&local_39);
  kindAsString(expected);
  std::__cxx11::string::append((char *)&error);
  std::__cxx11::string::append((char *)&error);
  kindAsString(this->kind);
  std::__cxx11::string::append((char *)&error);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&error);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void value::throwIfNotKind(Kind expected) const
{
	if (kind == expected)
		return;
	
	std::string error = "Illegal cast to ";
	error += kindAsString(expected);
	error += "; type is actually ";
	error += kindAsString(kind);
	throw std::runtime_error(std::move(error));
}